

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxScript.cpp
# Opt level: O0

Variant * __thiscall
Jinx::Impl::Script::CallNativeFunction
          (Variant *__return_storage_ptr__,Script *this,FunctionDefinitionPtr *fnDef)

{
  element_type *peVar1;
  size_type sVar2;
  enable_shared_from_this<Jinx::Impl::Script> local_b0;
  shared_ptr<Jinx::IScript> local_a0;
  FunctionCallback local_90;
  ulong local_70;
  size_t i_1;
  value_type *param;
  size_t index;
  size_t i;
  ulong local_40;
  size_t numParams;
  Parameters params;
  FunctionDefinitionPtr *fnDef_local;
  Script *this_local;
  
  params.super__Vector_base<Jinx::Variant,_Jinx::Allocator<Jinx::Variant>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)fnDef;
  std::vector<Jinx::Variant,_Jinx::Allocator<Jinx::Variant>_>::vector
            ((vector<Jinx::Variant,_Jinx::Allocator<Jinx::Variant>_> *)&numParams);
  peVar1 = std::
           __shared_ptr_access<Jinx::Impl::FunctionDefinition,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<Jinx::Impl::FunctionDefinition,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)params.super__Vector_base<Jinx::Variant,_Jinx::Allocator<Jinx::Variant>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage);
  local_40 = FunctionDefinition::GetParameterCount(peVar1);
  for (index = 0; index < local_40; index = index + 1) {
    sVar2 = std::vector<Jinx::Variant,_Jinx::StaticAllocator<Jinx::Variant,_4096UL,_16UL>_>::size
                      (&this->m_stack);
    param = (value_type *)(sVar2 + (index - local_40));
    i_1 = (size_t)std::vector<Jinx::Variant,_Jinx::StaticAllocator<Jinx::Variant,_4096UL,_16UL>_>::
                  operator[](&this->m_stack,(size_type)param);
    std::vector<Jinx::Variant,_Jinx::Allocator<Jinx::Variant>_>::push_back
              ((vector<Jinx::Variant,_Jinx::Allocator<Jinx::Variant>_> *)&numParams,
               (value_type *)i_1);
  }
  for (local_70 = 0; local_70 < local_40; local_70 = local_70 + 1) {
    std::vector<Jinx::Variant,_Jinx::StaticAllocator<Jinx::Variant,_4096UL,_16UL>_>::pop_back
              (&this->m_stack);
  }
  peVar1 = std::
           __shared_ptr_access<Jinx::Impl::FunctionDefinition,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<Jinx::Impl::FunctionDefinition,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)params.super__Vector_base<Jinx::Variant,_Jinx::Allocator<Jinx::Variant>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage);
  FunctionDefinition::GetCallback(&local_90,peVar1);
  std::enable_shared_from_this<Jinx::Impl::Script>::shared_from_this(&local_b0);
  std::shared_ptr<Jinx::IScript>::shared_ptr<Jinx::Impl::Script,void>
            (&local_a0,(shared_ptr<Jinx::Impl::Script> *)&local_b0);
  std::
  function<Jinx::Variant_(std::shared_ptr<Jinx::IScript>,_const_std::vector<Jinx::Variant,_Jinx::Allocator<Jinx::Variant>_>_&)>
  ::operator()(__return_storage_ptr__,&local_90,&local_a0,
               (vector<Jinx::Variant,_Jinx::Allocator<Jinx::Variant>_> *)&numParams);
  std::shared_ptr<Jinx::IScript>::~shared_ptr(&local_a0);
  std::shared_ptr<Jinx::Impl::Script>::~shared_ptr((shared_ptr<Jinx::Impl::Script> *)&local_b0);
  std::
  function<Jinx::Variant_(std::shared_ptr<Jinx::IScript>,_const_std::vector<Jinx::Variant,_Jinx::Allocator<Jinx::Variant>_>_&)>
  ::~function(&local_90);
  std::vector<Jinx::Variant,_Jinx::Allocator<Jinx::Variant>_>::~vector
            ((vector<Jinx::Variant,_Jinx::Allocator<Jinx::Variant>_> *)&numParams);
  return __return_storage_ptr__;
}

Assistant:

inline_t Variant Script::CallNativeFunction(const FunctionDefinitionPtr & fnDef)
	{
		Parameters params;
		size_t numParams = fnDef->GetParameterCount();
		for (size_t i = 0; i < numParams; ++i)
		{
			size_t index = m_stack.size() - (numParams - i);
			const auto & param = m_stack[index];
			params.push_back(param);
		}
		for (size_t i = 0; i < numParams; ++i)
			m_stack.pop_back();
		return fnDef->GetCallback()(shared_from_this(), params);
	}